

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# CliffordLib.cpp
# Opt level: O3

Clifford * operator/(Clifford *__return_storage_ptr__,Clifford *A,Clifford *B)

{
  vector<Blade,_std::allocator<Blade>_> vStack_58;
  Clifford local_40;
  vector<Blade,_std::allocator<Blade>_> local_28;
  
  std::vector<Blade,_std::allocator<Blade>_>::vector(&local_28,A);
  std::vector<Blade,_std::allocator<Blade>_>::vector(&vStack_58,B);
  inverse(&local_40,&vStack_58);
  operator*(__return_storage_ptr__,&local_28,&local_40);
  std::vector<Blade,_std::allocator<Blade>_>::~vector(&local_40);
  std::vector<Blade,_std::allocator<Blade>_>::~vector(&vStack_58);
  std::vector<Blade,_std::allocator<Blade>_>::~vector(&local_28);
  return __return_storage_ptr__;
}

Assistant:

Clifford operator/(Clifford A, Clifford B)
{
	return A*inverse(B);
}